

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O2

void __thiscall
itlib::small_vector<double,_4UL,_0UL,_std::allocator<double>_>::~small_vector
          (small_vector<double,_4UL,_0UL,_std::allocator<double>_> *this)

{
  this->m_end = this->m_begin;
  if (this->m_dynamic_data != (pointer)0x0) {
    operator_delete(this->m_dynamic_data,this->m_dynamic_capacity << 3);
    return;
  }
  return;
}

Assistant:

~small_vector()
    {
        clear();

        if (m_dynamic_data)
        {
            atraits::deallocate(get_alloc(), m_dynamic_data, m_dynamic_capacity);
        }
    }